

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

t_int * tabplay_tilde_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int local_48;
  int local_44;
  int local_40;
  int n3;
  int nxfer;
  int endphase;
  int phase;
  int n;
  t_word *wp;
  t_sample *out;
  t_tabplay_tilde *x;
  t_int *w_local;
  
  lVar2 = w[1];
  wp = (t_word *)w[2];
  endphase = (int)w[3];
  iVar1 = *(int *)(lVar2 + 0x38);
  if (*(int *)(lVar2 + 0x3c) < *(int *)(lVar2 + 0x40)) {
    local_48 = *(int *)(lVar2 + 0x3c);
  }
  else {
    local_48 = *(int *)(lVar2 + 0x40);
  }
  if ((*(long *)(lVar2 + 0x48) == 0) || (local_48 <= iVar1)) {
    while (endphase != 0) {
      wp->w_float = 0.0;
      endphase = endphase + -1;
      wp = (t_word *)((long)wp + 4);
    }
  }
  else {
    local_40 = local_48 - iVar1;
    if (endphase < local_48 - iVar1) {
      local_40 = endphase;
    }
    local_44 = endphase - local_40;
    iVar3 = local_40 + iVar1;
    _phase = (t_float *)(*(long *)(lVar2 + 0x48) + (long)iVar1 * 8);
    while (local_40 != 0) {
      wp->w_float = *_phase;
      local_40 = local_40 + -1;
      _phase = _phase + 2;
      wp = (t_word *)((long)wp + 4);
    }
    if (iVar3 < local_48) {
      *(int *)(lVar2 + 0x38) = iVar3;
    }
    else {
      clock_delay(*(_clock **)(lVar2 + 0x58),0.0);
      *(undefined4 *)(lVar2 + 0x38) = 0x7fffffff;
      while (local_44 != 0) {
        wp->w_float = 0.0;
        local_44 = local_44 + -1;
        wp = (t_word *)((long)wp + 4);
      }
    }
  }
  w_local = w + 4;
  return w_local;
}

Assistant:

static t_int *tabplay_tilde_perform(t_int *w)
{
    t_tabplay_tilde *x = (t_tabplay_tilde *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_word *wp;
    int n = (int)(w[3]), phase = x->x_phase,
        endphase = (x->x_nsampsintab < x->x_limit ?
            x->x_nsampsintab : x->x_limit), nxfer, n3;
    if (!x->x_vec || phase >= endphase)
        goto zero;

    nxfer = endphase - phase;
    wp = x->x_vec + phase;
    if (nxfer > n)
        nxfer = n;
    n3 = n - nxfer;
    phase += nxfer;
    while (nxfer--)
        *out++ = (wp++)->w_float;
    if (phase >= endphase)
    {
        clock_delay(x->x_clock, 0);
        x->x_phase = 0x7fffffff;
        while (n3--)
            *out++ = 0;
    }
    else x->x_phase = phase;

    return (w+4);
zero:
    while (n--) *out++ = 0;
    return (w+4);
}